

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  VTable *pVVar1;
  char *zFormat;
  VTable **ppVVar2;
  
  if (pTab->nModuleArg == 0) {
LAB_00176a35:
    if ((((pTab->tabFlags & 1) == 0) || ((pParse->db->flags & 1) != 0)) || (pParse->nested != '\0'))
    {
      if (viewOk != 0) {
        return 0;
      }
      if (pTab->pSelect == (Select *)0x0) {
        return 0;
      }
      zFormat = "cannot modify %s because it is a view";
      goto LAB_00176a67;
    }
  }
  else {
    ppVVar2 = &pTab->pVTable;
    do {
      pVVar1 = *ppVVar2;
      ppVVar2 = &pVVar1->pNext;
    } while (pVVar1->db != pParse->db);
    if (pVVar1->pMod->pModule->xUpdate !=
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)
    goto LAB_00176a35;
  }
  zFormat = "table %s may not be modified";
LAB_00176a67:
  sqlite3ErrorMsg(pParse,zFormat,pTab->zName);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  /* A table is not writable under the following circumstances:
  **
  **   1) It is a virtual table and no implementation of the xUpdate method
  **      has been provided, or
  **   2) It is a system table (i.e. sqlite_master), this call is not
  **      part of a nested parse and writable_schema pragma has not 
  **      been specified.
  **
  ** In either case leave an error message in pParse and return non-zero.
  */
  if( ( IsVirtual(pTab) 
     && sqlite3GetVTable(pParse->db, pTab)->pMod->pModule->xUpdate==0 )
   || ( (pTab->tabFlags & TF_Readonly)!=0
     && (pParse->db->flags & SQLITE_WriteSchema)==0
     && pParse->nested==0 )
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }

#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && pTab->pSelect ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}